

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O2

string * __thiscall
LinkLanguageAndIdNode::Evaluate
          (string *__return_storage_ptr__,LinkLanguageAndIdNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *dagChecker)

{
  cmMakefile *this_00;
  bool bVar1;
  __type _Var2;
  int iVar3;
  long lVar4;
  string *__rhs;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  idParameter;
  string genName;
  allocator<char> local_b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70;
  GeneratorExpressionContent *local_58;
  allocator<char> local_50 [32];
  
  if (((dagChecker == (cmGeneratorExpressionDAGChecker *)0x0) ||
      (context->HeadTarget == (cmGeneratorTarget *)0x0)) ||
     ((bVar1 = cmGeneratorExpressionDAGChecker::EvaluatingLinkExpression(dagChecker), !bVar1 &&
      (bVar1 = cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries
                         (dagChecker,(cmGeneratorTarget *)0x0,ANY), !bVar1)))) {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_b0,content);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,
               "$<LINK_LANG_AND_ID:lang,id> may only be used with binary targets to specify link libraries, link directories, link options, and link depends."
               ,local_50);
    reportError(context,&local_b0,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    (*context->LG->GlobalGenerator->_vptr_cmGlobalGenerator[3])(local_50);
    lVar4 = std::__cxx11::string::find((char *)local_50,0x64b38e);
    if ((((lVar4 == -1) &&
         (lVar4 = std::__cxx11::string::find((char *)local_50,0x5ff480), lVar4 == -1)) &&
        (lVar4 = std::__cxx11::string::find((char *)local_50,0x620ef1), lVar4 == -1)) &&
       ((lVar4 = std::__cxx11::string::find((char *)local_50,0x647887), lVar4 == -1 &&
        (lVar4 = std::__cxx11::string::find((char *)local_50,0x62ab8f), lVar4 == -1)))) {
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_b0,content);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,"$<LINK_LANG_AND_ID:lang,id> not supported for this generator."
                 ,(allocator<char> *)&local_70);
      reportError(context,&local_b0,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    }
    else {
      bVar1 = cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries
                        (dagChecker,(cmGeneratorTarget *)0x0,ANY);
      if (bVar1) {
        context->HadHeadSensitiveCondition = true;
        context->HadLinkLanguageSensitiveCondition = true;
      }
      _Var2 = std::operator==(&context->Language,
                              (parameters->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start);
      if (_Var2) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        vector<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_70,
                   (parameters->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + 1,
                   (parameters->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish,(allocator_type *)&local_b0);
        this_00 = context->LG->Makefile;
        std::operator+(&local_90,"CMAKE_",&context->Language);
        std::operator+(&local_b0,&local_90,"_COMPILER_ID");
        __rhs = cmMakefile::GetSafeDefinition(this_00,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_90);
        if (local_70.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            local_70.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)__rhs);
        }
        else if (__rhs->_M_string_length == 0) {
          __s = "0";
          if ((local_70.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_string_length == 0) {
            __s = "1";
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,__s,(allocator<char> *)&local_b0);
        }
        else {
          s = local_70.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
          local_58 = content;
          if (((anonymous_namespace)::LinkerId::
               Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,std::__cxx11::string_const&)
               ::linkerIdValidator == '\0') &&
             (iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::LinkerId::
                                           Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,std::__cxx11::string_const&)
                                           ::linkerIdValidator),
             s = local_70.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start, iVar3 != 0)) {
            cmsys::RegularExpression::RegularExpression
                      ((RegularExpression *)
                       (anonymous_namespace)::LinkerId::
                       Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,std::__cxx11::string_const&)
                       ::linkerIdValidator,"^[A-Za-z0-9_]*$");
            __cxa_atexit(cmsys::RegularExpression::~RegularExpression,
                         (anonymous_namespace)::LinkerId::
                         Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,std::__cxx11::string_const&)
                         ::linkerIdValidator,&__dso_handle);
            __cxa_guard_release(&(anonymous_namespace)::LinkerId::
                                 Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,std::__cxx11::string_const&)
                                 ::linkerIdValidator);
            s = local_70.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
          }
          do {
            if (s == local_70.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)__return_storage_ptr__,"0",(allocator<char> *)&local_b0);
              goto LAB_00471cc6;
            }
            bVar1 = cmsys::RegularExpression::find
                              ((RegularExpression *)
                               (anonymous_namespace)::LinkerId::
                               Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,std::__cxx11::string_const&)
                               ::linkerIdValidator,s);
            if (!bVar1) {
              GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_b0,local_58);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_90,"Expression syntax not recognized.",&local_b1);
              reportError(context,&local_b0,&local_90);
              std::__cxx11::string::~string((string *)&local_90);
              std::__cxx11::string::~string((string *)&local_b0);
              (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2
              ;
              __return_storage_ptr__->_M_string_length = 0;
              (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
              goto LAB_00471cc6;
            }
            _Var2 = std::operator==(s,__rhs);
            s = s + 1;
          } while (!_Var2);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,"1",(allocator<char> *)&local_b0);
        }
LAB_00471cc6:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_70);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"0",(allocator<char> *)&local_b0);
      }
    }
    std::__cxx11::string::~string((string *)local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(
    const std::vector<std::string>& parameters,
    cmGeneratorExpressionContext* context,
    const GeneratorExpressionContent* content,
    cmGeneratorExpressionDAGChecker* dagChecker) const override
  {
    if (!context->HeadTarget || !dagChecker ||
        !(dagChecker->EvaluatingLinkExpression() ||
          dagChecker->EvaluatingLinkLibraries())) {
      reportError(
        context, content->GetOriginalExpression(),
        "$<LINK_LANG_AND_ID:lang,id> may only be used with binary targets "
        "to specify link libraries, link directories, link options, and link "
        "depends.");
      return std::string();
    }

    cmGlobalGenerator* gg = context->LG->GetGlobalGenerator();
    std::string genName = gg->GetName();
    if (genName.find("Makefiles") == std::string::npos &&
        genName.find("Ninja") == std::string::npos &&
        genName.find("Visual Studio") == std::string::npos &&
        genName.find("Xcode") == std::string::npos &&
        genName.find("Watcom WMake") == std::string::npos) {
      reportError(
        context, content->GetOriginalExpression(),
        "$<LINK_LANG_AND_ID:lang,id> not supported for this generator.");
      return std::string();
    }

    if (dagChecker->EvaluatingLinkLibraries()) {
      context->HadHeadSensitiveCondition = true;
      context->HadLinkLanguageSensitiveCondition = true;
    }

    const std::string& lang = context->Language;
    if (lang == parameters.front()) {
      std::vector<std::string> idParameter((parameters.cbegin() + 1),
                                           parameters.cend());
      return LinkerId::Evaluate(idParameter, context, content, lang);
    }
    return "0";
  }